

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscPStackEntry.h
# Opt level: O1

bool __thiscall CNscPStackEntry::IsIntegerPowerOf2(CNscPStackEntry *this)

{
  uint uVar1;
  bool bVar2;
  
  if (((this->m_nDataSize == 0) || (*(size_t *)this->m_pauchData != this->m_nDataSize)) ||
     ((int)*(size_t *)((long)this->m_pauchData + 8) != 0x34)) {
    bVar2 = false;
  }
  else {
    if (this->m_nType != NscType_Integer) {
      __assert_fail("GetType () == NscType_Integer",
                    "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                    ,0x1a2,"bool CNscPStackEntry::IsIntegerPowerOf2() const");
    }
    uVar1 = GetInteger(this);
    bVar2 = (uVar1 & uVar1 - 1) == 0;
  }
  return bVar2;
}

Assistant:

bool IsIntegerPowerOf2 () const
	{
		unsigned int nValue;

		if (!IsSimpleConstant ())
			return false;

		assert (GetType () == NscType_Integer);
		nValue = (unsigned int) GetInteger ();

		return (nValue & (nValue - 1)) == 0;
	}